

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

bool __thiscall
duckdb::Value::DefaultTryCastAs
          (Value *this,LogicalType *target_type,Value *new_value,string *error_message,bool strict)

{
  bool bVar1;
  CastFunctionSet set;
  GetCastFunctionInput get_input;
  CastFunctionSet local_68;
  GetCastFunctionInput local_40;
  
  CastFunctionSet::CastFunctionSet(&local_68);
  local_40.context.ptr = (ClientContext *)0x0;
  local_40.query_location.index = 0xffffffffffffffff;
  bVar1 = TryCastAs(this,&local_68,&local_40,target_type,new_value,error_message,strict);
  ::std::vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>::~vector
            (&local_68.bind_functions.
              super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>);
  return bVar1;
}

Assistant:

bool Value::DefaultTryCastAs(const LogicalType &target_type, Value &new_value, string *error_message,
                             bool strict) const {
	CastFunctionSet set;
	GetCastFunctionInput get_input;
	return TryCastAs(set, get_input, target_type, new_value, error_message, strict);
}